

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbf.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
PaysForRBF_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,CAmount original_fees,CAmount replacement_fees,
          size_t replacement_vsize,CFeeRate relay_fee,uint256 *txid)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  CAmount CVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  long in_FS_OFFSET;
  CFeeRate local_c0;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c0.nSatoshisPerK = relay_fee.nSatoshisPerK;
  if (replacement_fees < original_fees) {
    base_blob<256u>::ToString_abi_cxx11_(&local_78,txid);
    FormatMoney_abi_cxx11_(&local_98,replacement_fees);
    FormatMoney_abi_cxx11_(&local_b8,original_fees);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (&local_58,
               (tinyformat *)"rejecting replacement %s, less fees than conflicting txs; %s < %s",
               (char *)&local_78,&local_98,&local_b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)txid);
  }
  else {
    args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)txid;
    CVar3 = CFeeRate::GetFee(&local_c0,(uint32_t)replacement_vsize);
    if (CVar3 <= replacement_fees - original_fees) {
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      goto LAB_00288786;
    }
    base_blob<256u>::ToString_abi_cxx11_(&local_78,txid);
    FormatMoney_abi_cxx11_(&local_98,replacement_fees - original_fees);
    CVar3 = CFeeRate::GetFee(&local_c0,(uint32_t)replacement_vsize);
    FormatMoney_abi_cxx11_(&local_b8,CVar3);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (&local_58,
               (tinyformat *)
               "rejecting replacement %s, not enough additional fees to relay; %s < %s",
               (char *)&local_78,&local_98,&local_b8,args_2);
  }
  puVar1 = (undefined8 *)
           ((long)&(__return_storage_ptr__->
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload + 0x10);
  *(undefined8 **)
   &(__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload = puVar1;
  paVar2 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == paVar2) {
    *puVar1 = CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0]
                      );
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_payload + 0x18) = local_58.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = local_58._M_dataplus._M_p;
    *(ulong *)((long)&(__return_storage_ptr__->
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      )._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload + 0x10) =
         CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0]);
  }
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = local_58._M_string_length;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = true;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
LAB_00288786:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::string> PaysForRBF(CAmount original_fees,
                                      CAmount replacement_fees,
                                      size_t replacement_vsize,
                                      CFeeRate relay_fee,
                                      const uint256& txid)
{
    // Rule #3: The replacement fees must be greater than or equal to fees of the
    // transactions it replaces, otherwise the bandwidth used by those conflicting transactions
    // would not be paid for.
    if (replacement_fees < original_fees) {
        return strprintf("rejecting replacement %s, less fees than conflicting txs; %s < %s",
                         txid.ToString(), FormatMoney(replacement_fees), FormatMoney(original_fees));
    }

    // Rule #4: The new transaction must pay for its own bandwidth. Otherwise, we have a DoS
    // vector where attackers can cause a transaction to be replaced (and relayed) repeatedly by
    // increasing the fee by tiny amounts.
    CAmount additional_fees = replacement_fees - original_fees;
    if (additional_fees < relay_fee.GetFee(replacement_vsize)) {
        return strprintf("rejecting replacement %s, not enough additional fees to relay; %s < %s",
                         txid.ToString(),
                         FormatMoney(additional_fees),
                         FormatMoney(relay_fee.GetFee(replacement_vsize)));
    }
    return std::nullopt;
}